

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O1

void printDualSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,NameSet *colnames,NameSet *rownames,bool real,bool rational)

{
  long *plVar1;
  uint *puVar2;
  byte bVar3;
  Verbosity VVar4;
  uint uVar5;
  Verbosity VVar6;
  Tolerances *pTVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  ostream *poVar9;
  ostream **ppoVar10;
  long lVar11;
  Real RVar12;
  double dVar13;
  char cVar14;
  pointer pnVar15;
  undefined8 uVar16;
  NameSet *pNVar17;
  bool bVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  size_t sVar22;
  SPxOut *pSVar23;
  Verbosity old_verbosity;
  long lVar24;
  undefined7 in_register_00000081;
  char *pcVar25;
  long lVar26;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dual;
  Verbosity old_verbosity_8;
  VectorRational dual_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  redcost;
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  local_320;
  limb_type local_308;
  undefined8 uStack_300;
  data_type local_2f8;
  undefined5 local_2e8;
  char cStack_2e3;
  char cStack_2e2;
  undefined6 uStack_2e1;
  undefined3 uStack_2db;
  uint local_2d8;
  undefined4 uStack_2d4;
  undefined5 local_2d0;
  undefined3 uStack_2cb;
  undefined8 local_2c8;
  undefined1 local_2b8 [16];
  pointer local_2a8;
  uint auStack_2a0 [2];
  uint local_298 [2];
  uint local_290;
  bool local_28c;
  limb_type local_288;
  long local_280;
  long local_278;
  NameSet *local_270;
  long local_268;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_260;
  NameSet *local_248;
  SPxOut *local_240;
  data_type local_238;
  char local_223;
  char local_222;
  uint local_218;
  void *local_210;
  char local_203;
  char local_202;
  data_type local_1f8;
  char local_1e3;
  char local_1e2;
  uint local_1d8;
  void *local_1d0;
  char local_1c3;
  char local_1c2;
  data_type local_1b8;
  char local_1a3;
  char local_1a2;
  uint local_198;
  void *local_190;
  char local_183;
  char local_182;
  pointer local_178;
  pointer pnStack_170;
  pointer local_168;
  uint auStack_160 [2];
  uint local_158 [4];
  pointer local_148;
  pointer pnStack_140;
  pointer local_138;
  uint auStack_130 [2];
  uint local_128 [4];
  pointer local_118;
  pointer pnStack_110;
  pointer local_108;
  uint auStack_100 [2];
  uint local_f8 [4];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_268 = CONCAT44(local_268._4_4_,(int)CONCAT71(in_register_00000081,rational));
  pTVar7 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var8 = (soplex->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    }
  }
  local_270 = rownames;
  RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
  dVar13 = log10(RVar12);
  iVar19 = (int)-dVar13;
  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  }
  iVar20 = iVar19 + 10;
  local_248 = colnames;
  if (real) {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&local_320,
                 (soplex->_realLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    bVar18 = ::soplex::
             SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::getDualFarkas(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)&local_320);
    if (bVar18) {
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nDual ray (name, value):\n",0x19);
        (soplex->spxout).m_verbosity = VVar4;
      }
      if (0 < (soplex->_realLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_278 = (long)iVar20;
        local_280 = (long)iVar19;
        lVar26 = 6;
        lVar24 = 0;
        do {
          local_f8._0_8_ =
               *(undefined8 *)
                ((long)local_320.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -0x10);
          plVar1 = (long *)((long)local_320.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -0x30);
          local_118 = (pointer)*plVar1;
          pnStack_110 = (pointer)plVar1[1];
          puVar2 = (uint *)((long)local_320.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -0x20);
          local_108 = *(pointer *)puVar2;
          auStack_100 = *(uint (*) [2])(puVar2 + 2);
          uVar5 = *(uint *)((long)local_320.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -8);
          bVar3 = *(byte *)((long)local_320.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -4);
          local_308 = ((local_320.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.num.m_backend
                      .
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.la[lVar26];
          uStack_300 = 0;
          pTVar7 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var8 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            }
          }
          RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
          local_298[0] = local_f8[0];
          local_298[1] = local_f8[1];
          local_2a8 = local_108;
          auStack_2a0[0] = auStack_100[0];
          auStack_2a0[1] = auStack_100[1];
          local_2b8._0_8_ = local_118;
          uVar16 = local_2b8._0_8_;
          local_2b8._8_8_ = pnStack_110;
          local_288 = local_308;
          local_28c = (bool)bVar3;
          if ((bVar3 != 0) &&
             (local_2b8._0_4_ = SUB84(local_118,0),
             local_2b8._0_4_ != 0 || (Verbosity)local_308 != 0)) {
            local_28c = (bool)(bVar3 ^ 1);
          }
          bVar18 = false;
          local_2b8._0_8_ = uVar16;
          local_290 = uVar5;
          if (((Verbosity)local_308 != 2) && (!NAN(RVar12))) {
            local_2c8 = 0xa00000000;
            local_2f8.double_first = 0;
            local_2e8 = 0;
            cStack_2e3 = '\0';
            cStack_2e2 = '\0';
            uStack_2e1 = 0;
            uStack_2db = 0;
            local_2d8 = 0;
            uStack_2d4 = 0;
            local_2d0 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_2f8.ld,RVar12);
            iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_2b8,
                                (cpp_dec_float<50U,_int,_void> *)&local_2f8.ld);
            bVar18 = 0 < iVar21;
          }
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          if ((bVar18) && (VVar4 = (soplex->spxout).m_verbosity, 2 < (int)VVar4)) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar9 = (soplex->spxout).m_streams[3];
            if (local_270->mem == (char *)0x0) {
              std::ios::clear((int)poVar9 + (int)*(undefined8 *)(*(long *)poVar9 + -0x18));
            }
            else {
              pcVar25 = local_270->mem +
                        (local_270->set).theitem[(local_270->set).thekey[lVar24].idx].data;
              sVar22 = strlen(pcVar25);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar25,sVar22);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            VVar6 = (soplex->spxout).m_verbosity;
            ppoVar10 = (soplex->spxout).m_streams;
            poVar9 = ppoVar10[VVar6];
            lVar11 = *(long *)poVar9;
            *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 0x10) = local_278;
            *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = local_280;
            puVar2 = (uint *)((long)local_320.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -0x30);
            local_68.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_68.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_320.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -0x20);
            local_68.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_68.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_68.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)
                  ((long)local_320.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -0x10);
            local_68.m_backend.exp =
                 *(int *)((long)local_320.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -8);
            local_68.m_backend.neg =
                 *(bool *)((long)local_320.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar26 * 8 + -4);
            local_68.m_backend._48_8_ =
                 ((local_320.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.num.m_backend.
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_data.la[lVar26];
            boost::multiprecision::operator<<(ppoVar10[VVar6],&local_68);
            poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar14 = (char)poVar9;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
            std::ostream::put(cVar14);
            std::ostream::flush();
            (soplex->spxout).m_verbosity = VVar4;
          }
          lVar24 = lVar24 + 1;
          lVar26 = lVar26 + 7;
        } while (lVar24 < (soplex->_realLP->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other entries are zero (within ",0x23);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar24 = *(long *)poVar9;
        *(undefined8 *)(poVar9 + *(long *)(lVar24 + -0x18) + 8) = 1;
        lVar24 = *(long *)(lVar24 + -0x18);
        *(uint *)(poVar9 + lVar24 + 0x18) = *(uint *)(poVar9 + lVar24 + 0x18) & 0xfffffefb | 0x100;
        pTVar7 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var8 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          }
        }
        RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
        std::ostream::_M_insert<double>(RVar12);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar24 = *(long *)poVar9;
        *(undefined8 *)(poVar9 + *(long *)(lVar24 + -0x18) + 8) = 8;
        lVar24 = *(long *)(lVar24 + -0x18);
        *(uint *)(poVar9 + lVar24 + 0x18) = *(uint *)(poVar9 + lVar24 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,").",2);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar14 = (char)poVar9;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
        std::ostream::put(cVar14);
        std::ostream::flush();
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
        }
        (soplex->spxout).m_verbosity = VVar4;
      }
    }
    else if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0xc8 & 4) != 0)) ||
             ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 4) != 0))))
            && (bVar18 = ::soplex::
                         SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::getDual(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)&local_320), bVar18)) {
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nDual solution (name, value):\n",0x1e);
        (soplex->spxout).m_verbosity = VVar4;
      }
      if (0 < (soplex->_realLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_278 = (long)iVar20;
        local_280 = (long)iVar19;
        lVar24 = 6;
        lVar26 = 0;
        do {
          local_128._0_8_ =
               *(undefined8 *)
                ((long)local_320.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -0x10);
          plVar1 = (long *)((long)local_320.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -0x30);
          local_148 = (pointer)*plVar1;
          pnStack_140 = (pointer)plVar1[1];
          puVar2 = (uint *)((long)local_320.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -0x20);
          local_138 = *(pointer *)puVar2;
          auStack_130 = *(uint (*) [2])(puVar2 + 2);
          uVar5 = *(uint *)((long)local_320.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -8);
          bVar3 = *(byte *)((long)local_320.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -4);
          local_308 = ((local_320.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.num.m_backend
                      .
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data.la[lVar24];
          uStack_300 = 0;
          pTVar7 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var8 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            }
          }
          RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
          local_298[0] = local_128[0];
          local_298[1] = local_128[1];
          local_2a8 = local_138;
          auStack_2a0[0] = auStack_130[0];
          auStack_2a0[1] = auStack_130[1];
          local_2b8._0_8_ = local_148;
          uVar16 = local_2b8._0_8_;
          local_2b8._8_8_ = pnStack_140;
          local_288 = local_308;
          local_28c = (bool)bVar3;
          if ((bVar3 != 0) &&
             (local_2b8._0_4_ = SUB84(local_148,0),
             local_2b8._0_4_ != 0 || (Verbosity)local_308 != 0)) {
            local_28c = (bool)(bVar3 ^ 1);
          }
          bVar18 = false;
          local_2b8._0_8_ = uVar16;
          local_290 = uVar5;
          if (((Verbosity)local_308 != 2) && (!NAN(RVar12))) {
            local_2c8 = 0xa00000000;
            local_2f8.double_first = 0;
            local_2e8 = 0;
            cStack_2e3 = '\0';
            cStack_2e2 = '\0';
            uStack_2e1 = 0;
            uStack_2db = 0;
            local_2d8 = 0;
            uStack_2d4 = 0;
            local_2d0 = 0;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_2f8.ld,RVar12);
            iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_2b8,
                                (cpp_dec_float<50U,_int,_void> *)&local_2f8.ld);
            bVar18 = 0 < iVar21;
          }
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          if ((bVar18) && (VVar4 = (soplex->spxout).m_verbosity, 2 < (int)VVar4)) {
            (soplex->spxout).m_verbosity = INFO1;
            poVar9 = (soplex->spxout).m_streams[3];
            if (local_270->mem == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + (int)poVar9);
            }
            else {
              pcVar25 = local_270->mem +
                        (local_270->set).theitem[(local_270->set).thekey[lVar26].idx].data;
              sVar22 = strlen(pcVar25);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar25,sVar22);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
            VVar6 = (soplex->spxout).m_verbosity;
            ppoVar10 = (soplex->spxout).m_streams;
            poVar9 = ppoVar10[VVar6];
            lVar11 = *(long *)poVar9;
            *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 0x10) = local_278;
            *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = local_280;
            puVar2 = (uint *)((long)local_320.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -0x30);
            local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)local_320.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -0x20);
            local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_a8.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)
                  ((long)local_320.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -0x10);
            local_a8.m_backend.exp =
                 *(int *)((long)local_320.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -8);
            local_a8.m_backend.neg =
                 *(bool *)((long)local_320.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar24 * 8 + -4);
            local_a8.m_backend._48_8_ =
                 ((local_320.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value.num.m_backend.
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_data.la[lVar24];
            boost::multiprecision::operator<<(ppoVar10[VVar6],&local_a8);
            poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
            cVar14 = (char)poVar9;
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
            std::ostream::put(cVar14);
            std::ostream::flush();
            (soplex->spxout).m_verbosity = VVar4;
          }
          lVar26 = lVar26 + 1;
          lVar24 = lVar24 + 7;
        } while (lVar26 < (soplex->_realLP->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other dual values are zero (within ",0x27);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar24 = *(long *)poVar9;
        *(undefined8 *)(poVar9 + *(long *)(lVar24 + -0x18) + 8) = 1;
        lVar24 = *(long *)(lVar24 + -0x18);
        *(uint *)(poVar9 + lVar24 + 0x18) = *(uint *)(poVar9 + lVar24 + 0x18) & 0xfffffefb | 0x100;
        pTVar7 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var8 = (soplex->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
          }
        }
        RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
        std::ostream::_M_insert<double>(RVar12);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        lVar24 = *(long *)poVar9;
        *(undefined8 *)(poVar9 + *(long *)(lVar24 + -0x18) + 8) = 8;
        lVar24 = *(long *)(lVar24 + -0x18);
        *(uint *)(poVar9 + lVar24 + 0x18) = *(uint *)(poVar9 + lVar24 + 0x18) & 0xfffffefb | 4;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,").",2);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar14 = (char)poVar9;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
        std::ostream::put(cVar14);
        std::ostream::flush();
        if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
        }
        (soplex->spxout).m_verbosity = VVar4;
      }
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::VectorBase(&local_260,
                   (soplex->_realLP->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
      bVar18 = ::soplex::
               SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::getRedCost(soplex,&local_260);
      if (bVar18) {
        pSVar23 = &soplex->spxout;
        VVar4 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar4) {
          (soplex->spxout).m_verbosity = INFO1;
          ::soplex::operator<<(pSVar23,"\nReduced costs (name, value):\n");
          (soplex->spxout).m_verbosity = VVar4;
        }
        local_240 = pSVar23;
        if (0 < (soplex->_realLP->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum) {
          local_278 = (long)iVar20;
          local_280 = (long)iVar19;
          lVar24 = 6;
          lVar26 = 0;
          do {
            local_158._0_8_ =
                 *(undefined8 *)
                  (((local_260.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                  lVar24 * 2 + -4);
            puVar2 = ((local_260.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar24 * 2 + -0xc;
            local_178 = *(pointer *)puVar2;
            pnStack_170 = *(pointer *)(puVar2 + 2);
            puVar2 = ((local_260.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar24 * 2 + -8;
            local_168 = *(pointer *)puVar2;
            auStack_160 = *(uint (*) [2])(puVar2 + 2);
            uVar5 = ((local_260.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                    [lVar24 * 2 + -2];
            bVar3 = (byte)((local_260.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                          [lVar24 * 2 + -1];
            local_308 = *(limb_type *)
                         (((local_260.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                         lVar24 * 2);
            uStack_300 = 0;
            pTVar7 = (soplex->_tolerances).
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var8 = (soplex->_tolerances).
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              }
            }
            RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
            local_298[0] = local_158[0];
            local_298[1] = local_158[1];
            local_2a8 = local_168;
            auStack_2a0[0] = auStack_160[0];
            auStack_2a0[1] = auStack_160[1];
            local_2b8._0_8_ = local_178;
            uVar16 = local_2b8._0_8_;
            local_2b8._8_8_ = pnStack_170;
            local_288 = local_308;
            local_28c = (bool)bVar3;
            if ((bVar3 != 0) &&
               (local_2b8._0_4_ = SUB84(local_178,0),
               local_2b8._0_4_ != 0 || (Verbosity)local_308 != 0)) {
              local_28c = (bool)(bVar3 ^ 1);
            }
            bVar18 = false;
            local_2b8._0_8_ = uVar16;
            local_290 = uVar5;
            if (((Verbosity)local_308 != 2) && (!NAN(RVar12))) {
              local_2c8 = 0xa00000000;
              local_2f8.double_first = 0;
              local_2e8 = 0;
              cStack_2e3 = '\0';
              cStack_2e2 = '\0';
              uStack_2e1 = 0;
              uStack_2db = 0;
              local_2d8 = 0;
              uStack_2d4 = 0;
              local_2d0 = 0;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&local_2f8.ld,RVar12);
              iVar21 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_2b8,
                                  (cpp_dec_float<50U,_int,_void> *)&local_2f8.ld);
              bVar18 = 0 < iVar21;
            }
            if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
            }
            if ((bVar18) && (VVar4 = (soplex->spxout).m_verbosity, 2 < (int)VVar4)) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar9 = (soplex->spxout).m_streams[3];
              if (local_248->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + (int)poVar9);
              }
              else {
                pcVar25 = local_248->mem +
                          (local_248->set).theitem[(local_248->set).thekey[lVar26].idx].data;
                sVar22 = strlen(pcVar25);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar25,sVar22);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              VVar6 = (soplex->spxout).m_verbosity;
              ppoVar10 = (soplex->spxout).m_streams;
              poVar9 = ppoVar10[VVar6];
              lVar11 = *(long *)poVar9;
              *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 0x10) = local_278;
              *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = local_280;
              puVar2 = ((local_260.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar24 * 2 + -0xc;
              local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = ((local_260.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar24 * 2 + -8;
              local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_e8.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)
                    (((local_260.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                    lVar24 * 2 + -4);
              local_e8.m_backend.exp =
                   ((local_260.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                   [lVar24 * 2 + -2];
              local_e8.m_backend.neg =
                   SUB41(((local_260.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                         [lVar24 * 2 + -1],0);
              puVar2 = ((local_260.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                       lVar24 * 2;
              local_e8.m_backend.fpclass = puVar2[0];
              local_e8.m_backend.prec_elem = puVar2[1];
              boost::multiprecision::operator<<(ppoVar10[VVar6],&local_e8);
              poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar14 = (char)poVar9;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
              std::ostream::put(cVar14);
              std::ostream::flush();
              (soplex->spxout).m_verbosity = VVar4;
            }
            lVar26 = lVar26 + 1;
            lVar24 = lVar24 + 7;
          } while (lVar26 < (soplex->_realLP->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
        VVar4 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar4) {
          (soplex->spxout).m_verbosity = INFO1;
          pSVar23 = ::soplex::operator<<(local_240,"All other reduced costs are zero (within ");
          poVar9 = pSVar23->m_streams[pSVar23->m_verbosity];
          lVar24 = *(long *)poVar9;
          *(undefined8 *)(poVar9 + *(long *)(lVar24 + -0x18) + 8) = 1;
          lVar24 = *(long *)(lVar24 + -0x18);
          *(uint *)(poVar9 + lVar24 + 0x18) = *(uint *)(poVar9 + lVar24 + 0x18) & 0xfffffefb | 0x100
          ;
          pTVar7 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var8 = (soplex->_tolerances).
                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
            }
          }
          RVar12 = ::soplex::Tolerances::epsilon(pTVar7);
          std::ostream::_M_insert<double>(RVar12);
          poVar9 = pSVar23->m_streams[pSVar23->m_verbosity];
          lVar24 = *(long *)poVar9;
          *(undefined8 *)(poVar9 + *(long *)(lVar24 + -0x18) + 8) = 8;
          lVar24 = *(long *)(lVar24 + -0x18);
          *(uint *)(poVar9 + lVar24 + 0x18) = *(uint *)(poVar9 + lVar24 + 0x18) & 0xfffffefb | 4;
          pSVar23 = ::soplex::operator<<(pSVar23,").");
          std::endl<char,std::char_traits<char>>(pSVar23->m_streams[pSVar23->m_verbosity]);
          if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
          }
          (soplex->spxout).m_verbosity = VVar4;
        }
      }
      if (local_260.val.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_260.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_260.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_260.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No dual information available.\n",0x1f);
        (soplex->spxout).m_verbosity = VVar4;
      }
    }
    if (local_320.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_320.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_320.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_320.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((char)local_268 != '\0') {
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)local_2b8,
                 (soplex->_realLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
    bVar18 = ::soplex::
             SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::getDualFarkasRational
                       (soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                *)local_2b8);
    if (bVar18) {
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nDual ray (name, value):\n",0x19);
        (soplex->spxout).m_verbosity = VVar4;
      }
      pNVar17 = local_270;
      if (0 < (soplex->_realLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum) {
        local_268 = (long)iVar20;
        lVar24 = 0;
        lVar26 = 0;
        do {
          uVar16 = local_2b8._0_8_;
          local_320.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_2f8.ld,(longlong *)&local_320,(type *)0x0);
          iVar20 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                           *)uVar16)->m_value).num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar24),
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_2f8.ld);
          if ((local_2c8._5_1_ == '\0') && (local_2c8._6_1_ == '\0')) {
            operator_delete((void *)CONCAT35(uStack_2cb,local_2d0),(ulong)local_2d8 << 3);
          }
          if ((cStack_2e3 == '\0') && (cStack_2e2 == '\0')) {
            operator_delete(local_2f8.ld.data,(ulong)local_2f8.ld.capacity << 3);
          }
          if (iVar20 != 0) {
            VVar4 = (soplex->spxout).m_verbosity;
            local_308 = CONCAT44(local_308._4_4_,VVar4);
            if (2 < (int)VVar4) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar9 = (soplex->spxout).m_streams[3];
              if (pNVar17->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + (int)poVar9);
              }
              else {
                pcVar25 = pNVar17->mem +
                          (pNVar17->set).theitem[(pNVar17->set).thekey[lVar26].idx].data;
                sVar22 = strlen(pcVar25);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar25,sVar22);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              lVar11 = *(long *)poVar9;
              *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 0x10) = local_268;
              *(long *)(poVar9 + *(long *)(lVar11 + -0x18) + 8) = (long)iVar19;
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)&local_1b8.ld,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                               *)local_2b8._0_8_)->m_value).num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar24));
              boost::multiprecision::operator<<
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)&local_1b8.ld);
              poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar14 = (char)poVar9;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
              std::ostream::put(cVar14);
              std::ostream::flush();
              if ((local_183 == '\0') && (local_182 == '\0')) {
                operator_delete(local_190,(ulong)local_198 << 3);
              }
              if ((local_1a3 == '\0') && (local_1a2 == '\0')) {
                operator_delete(local_1b8.ld.data,(ulong)local_1b8.ld.capacity << 3);
              }
              (soplex->spxout).m_verbosity = (Verbosity)local_308;
            }
          }
          lVar26 = lVar26 + 1;
          lVar24 = lVar24 + 0x40;
        } while (lVar26 < (soplex->_realLP->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thenum);
      }
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other entries are zero.",0x1b);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar14 = (char)poVar9;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
        std::ostream::put(cVar14);
        std::ostream::flush();
        (soplex->spxout).m_verbosity = VVar4;
      }
    }
    if ((((soplex->_hasSolReal == true) && (((soplex->_solReal).field_0xc8 & 4) != 0)) ||
        ((soplex->_hasSolRational == true && (((soplex->_solRational).field_0xd0 & 4) != 0)))) &&
       (bVar18 = ::soplex::
                 SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::getDualRational(soplex,(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                           *)local_2b8), bVar18)) {
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"\nDual solution (name, value):\n",0x1e);
        (soplex->spxout).m_verbosity = VVar4;
      }
      pNVar17 = local_270;
      if (0 < (soplex->_rationalLP->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              .set.thenum) {
        lVar24 = 0;
        lVar26 = 0;
        do {
          uVar16 = local_2b8._0_8_;
          local_320.
          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor<long_long>
                    ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)&local_2f8.ld,(longlong *)&local_320,(type *)0x0);
          iVar19 = boost::multiprecision::backends::
                   rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                           *)uVar16)->m_value).num.m_backend.
                                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                        .m_data + lVar24),
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)&local_2f8.ld);
          if ((local_2c8._5_1_ == '\0') && (local_2c8._6_1_ == '\0')) {
            operator_delete((void *)CONCAT35(uStack_2cb,local_2d0),(ulong)local_2d8 << 3);
          }
          if ((cStack_2e3 == '\0') && (cStack_2e2 == '\0')) {
            operator_delete(local_2f8.ld.data,(ulong)local_2f8.ld.capacity << 3);
          }
          if (iVar19 != 0) {
            VVar4 = (soplex->spxout).m_verbosity;
            local_308 = CONCAT44(local_308._4_4_,VVar4);
            if (2 < (int)VVar4) {
              (soplex->spxout).m_verbosity = INFO1;
              poVar9 = (soplex->spxout).m_streams[3];
              if (pNVar17->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + (int)poVar9);
              }
              else {
                pcVar25 = pNVar17->mem +
                          (pNVar17->set).theitem[(pNVar17->set).thekey[lVar26].idx].data;
                sVar22 = strlen(pcVar25);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar25,sVar22);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)&local_1f8.ld,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)((long)&(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                               *)local_2b8._0_8_)->m_value).num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar24));
              boost::multiprecision::operator<<
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)&local_1f8.ld);
              poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar14 = (char)poVar9;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
              std::ostream::put(cVar14);
              std::ostream::flush();
              if ((local_1c3 == '\0') && (local_1c2 == '\0')) {
                operator_delete(local_1d0,(ulong)local_1d8 << 3);
              }
              if ((local_1e3 == '\0') && (local_1e2 == '\0')) {
                operator_delete(local_1f8.ld.data,(ulong)local_1f8.ld.capacity << 3);
              }
              (soplex->spxout).m_verbosity = (Verbosity)local_308;
            }
          }
          lVar26 = lVar26 + 1;
          lVar24 = lVar24 + 0x40;
        } while (lVar26 < (soplex->_rationalLP->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          .set.thenum);
      }
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"All other dual values are zero.",0x1f);
        poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
        cVar14 = (char)poVar9;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
        std::ostream::put(cVar14);
        std::ostream::flush();
        (soplex->spxout).m_verbosity = VVar4;
      }
      ::soplex::
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_320,
                   (soplex->_realLP->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
      bVar18 = ::soplex::
               SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::getRedCostRational(soplex,(VectorRational *)&local_320);
      if (bVar18) {
        VVar4 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar4) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"\nReduced costs (name, value):\n",0x1e);
          (soplex->spxout).m_verbosity = VVar4;
        }
        pNVar17 = local_248;
        if (0 < (soplex->_realLP->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum) {
          lVar24 = 0;
          lVar26 = 0;
          do {
            pnVar15 = local_320.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_260.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor<long_long>
                      ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)&local_2f8.ld,(longlong *)&local_260,(type *)0x0);
            iVar19 = boost::multiprecision::backends::
                     rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)((long)&(pnVar15->m_backend).m_value.num.m_backend.
                                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                          .m_data + lVar24),
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)&local_2f8.ld);
            if ((local_2c8._5_1_ == '\0') && (local_2c8._6_1_ == '\0')) {
              operator_delete((void *)CONCAT35(uStack_2cb,local_2d0),(ulong)local_2d8 << 3);
            }
            if ((cStack_2e3 == '\0') && (cStack_2e2 == '\0')) {
              operator_delete(local_2f8.ld.data,(ulong)local_2f8.ld.capacity << 3);
            }
            if ((iVar19 != 0) && (VVar4 = (soplex->spxout).m_verbosity, 2 < (int)VVar4)) {
              local_308 = CONCAT44(local_308._4_4_,VVar4);
              (soplex->spxout).m_verbosity = INFO1;
              poVar9 = (soplex->spxout).m_streams[3];
              if (pNVar17->mem == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(*(long *)poVar9 + -0x18) + (int)poVar9);
              }
              else {
                pcVar25 = pNVar17->mem +
                          (pNVar17->set).theitem[(pNVar17->set).thekey[lVar26].idx].data;
                sVar22 = strlen(pcVar25);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar25,sVar22);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],"\t",1);
              boost::multiprecision::backends::
              rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)&local_238.ld,
                                 (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                  *)((long)&((local_320.
                                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->m_backend)
                                            .m_value.num.m_backend.
                                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                            .m_data + lVar24));
              boost::multiprecision::operator<<
                        ((soplex->spxout).m_streams[(soplex->spxout).m_verbosity],
                         (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)&local_238.ld);
              VVar4 = (Verbosity)local_308;
              poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
              cVar14 = (char)poVar9;
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
              std::ostream::put(cVar14);
              std::ostream::flush();
              if ((local_203 == '\0') && (local_202 == '\0')) {
                operator_delete(local_210,(ulong)local_218 << 3);
              }
              if ((local_223 == '\0') && (local_222 == '\0')) {
                operator_delete(local_238.ld.data,(ulong)local_238.ld.capacity << 3);
              }
              (soplex->spxout).m_verbosity = VVar4;
            }
            lVar26 = lVar26 + 1;
            lVar24 = lVar24 + 0x40;
          } while (lVar26 < (soplex->_realLP->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum);
        }
        VVar4 = (soplex->spxout).m_verbosity;
        if (2 < (int)VVar4) {
          (soplex->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((soplex->spxout).m_streams[3],"All other reduced costs are zero.",0x21);
          poVar9 = (soplex->spxout).m_streams[(soplex->spxout).m_verbosity];
          cVar14 = (char)poVar9;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + cVar14);
          std::ostream::put(cVar14);
          std::ostream::flush();
          (soplex->spxout).m_verbosity = VVar4;
        }
      }
      std::
      vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
      ::~vector(&local_320);
    }
    else {
      VVar4 = (soplex->spxout).m_verbosity;
      if (2 < (int)VVar4) {
        (soplex->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((soplex->spxout).m_streams[3],"No dual (rational) solution available.\n",0x27);
        (soplex->spxout).m_verbosity = VVar4;
      }
    }
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::~vector((vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               *)local_2b8);
    return;
  }
  return;
}

Assistant:

static
void printDualSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                       bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> dual(soplex.numRows());

      if(soplex.getDualFarkas(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual ray (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed << ")." << std::endl;)
      }
      else if(soplex.isDualFeasible() && soplex.getDual(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual solution (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(isNotZero(dual[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other dual values are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed << ")." << std::endl;)

         VectorBase<R> redcost(soplex.numCols());

         if(soplex.getRedCost(redcost))
         {
            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nReduced costs (name, value):\n";)

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(isNotZero(redcost[i], soplex.tolerances()->epsilon()))
               {
                  SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                                << std::setw(printwidth) << std::setprecision(printprec)
                                << redcost[i] << std::endl;)
               }
            }

            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other reduced costs are zero (within "
                          << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                          << std::setprecision(8) << std::fixed << ")." << std::endl;)
         }
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual information available.\n")
      }

   if(rational)
   {
      VectorRational dual(soplex.numRows());

      if(soplex.getDualFarkasRational(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual ray (name, value):\n";)

         for(int i = 0; i < soplex.numRows(); ++i)
         {
            if(dual[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t"
                             << std::setw(printwidth)
                             << std::setprecision(printprec)
                             << dual[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isDualFeasible() && soplex.getDualRational(dual))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nDual solution (name, value):\n";)

         for(int i = 0; i < soplex.numRowsRational(); ++i)
         {
            if(dual[i] != (Rational) 0)
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << rownames[i] << "\t" << dual[i] << std::endl;)
            }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other dual values are zero." << std::endl;)

         VectorRational redcost(soplex.numCols());

         if(soplex.getRedCostRational(redcost))
         {
            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nReduced costs (name, value):\n";)

            for(int i = 0; i < soplex.numCols(); ++i)
            {
               if(redcost[i] != (Rational) 0)
                  SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << redcost[i] << std::endl;)
               }

            SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other reduced costs are zero." << std::endl;)
         }
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No dual (rational) solution available.\n")
      }
}